

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalysisManager.cpp
# Opt level: O2

AnalyzedScope * __thiscall
slang::analysis::AnalysisManager::getAnalyzedScope(AnalysisManager *this,Scope *scope)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  value_type_pointer ppVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  ulong uVar7;
  AnalyzedScope *pAVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  group_access_pointer this_00;
  undefined1 auVar13 [16];
  shared_lock_guard lck;
  int *local_58;
  char local_50;
  __int_type_conflict local_48;
  __int_type_conflict _Stack_47;
  __int_type_conflict _Stack_46;
  __int_type_conflict _Stack_45;
  __int_type_conflict _Stack_44;
  __int_type_conflict _Stack_43;
  __int_type_conflict _Stack_42;
  __int_type_conflict _Stack_41;
  __int_type_conflict _Stack_40;
  __int_type_conflict _Stack_3f;
  __int_type_conflict _Stack_3e;
  __int_type_conflict _Stack_3d;
  __int_type_conflict _Stack_3c;
  __int_type_conflict _Stack_3b;
  __int_type_conflict _Stack_3a;
  __int_type_conflict _Stack_39;
  
  boost::unordered::detail::foa::
  concurrent_table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
  ::shared_access((concurrent_table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                   *)&stack0xffffffffffffffa8);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = scope;
  uVar12 = SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar10 = uVar12 >> ((byte)(this->analyzedScopes).table_.
                            super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                            .arrays.
                            super_table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                            .groups_size_index & 0x3f);
  lVar11 = (uVar12 & 0xff) * 4;
  local_48 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>
             ::match_word(unsigned_long)::word[lVar11 + 0xc];
  _Stack_47 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>
              ::match_word(unsigned_long)::word[lVar11 + 0xd];
  _Stack_46 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>
              ::match_word(unsigned_long)::word[lVar11 + 0xe];
  _Stack_45 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>
              ::match_word(unsigned_long)::word[lVar11 + 0xf];
  uVar9 = 0;
  _Stack_44 = local_48;
  _Stack_43 = _Stack_47;
  _Stack_42 = _Stack_46;
  _Stack_41 = _Stack_45;
  _Stack_40 = local_48;
  _Stack_3f = _Stack_47;
  _Stack_3e = _Stack_46;
  _Stack_3d = _Stack_45;
  _Stack_3c = local_48;
  _Stack_3b = _Stack_47;
  _Stack_3a = _Stack_46;
  _Stack_39 = _Stack_45;
  do {
    pgVar2 = (this->analyzedScopes).table_.
             super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
             .arrays.
             super_table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
             .groups_;
    pgVar1 = pgVar2 + uVar10;
    auVar13[0] = -(pgVar1->m[0].n.super___atomic_base<unsigned_char>._M_i == local_48);
    auVar13[1] = -(pgVar1->m[1].n.super___atomic_base<unsigned_char>._M_i == _Stack_47);
    auVar13[2] = -(pgVar1->m[2].n.super___atomic_base<unsigned_char>._M_i == _Stack_46);
    auVar13[3] = -(pgVar1->m[3].n.super___atomic_base<unsigned_char>._M_i == _Stack_45);
    auVar13[4] = -(pgVar1->m[4].n.super___atomic_base<unsigned_char>._M_i == _Stack_44);
    auVar13[5] = -(pgVar1->m[5].n.super___atomic_base<unsigned_char>._M_i == _Stack_43);
    auVar13[6] = -(pgVar1->m[6].n.super___atomic_base<unsigned_char>._M_i == _Stack_42);
    auVar13[7] = -(pgVar1->m[7].n.super___atomic_base<unsigned_char>._M_i == _Stack_41);
    auVar13[8] = -(pgVar1->m[8].n.super___atomic_base<unsigned_char>._M_i == _Stack_40);
    auVar13[9] = -(pgVar1->m[9].n.super___atomic_base<unsigned_char>._M_i == _Stack_3f);
    auVar13[10] = -(pgVar1->m[10].n.super___atomic_base<unsigned_char>._M_i == _Stack_3e);
    auVar13[0xb] = -(pgVar1->m[0xb].n.super___atomic_base<unsigned_char>._M_i == _Stack_3d);
    auVar13[0xc] = -(pgVar1->m[0xc].n.super___atomic_base<unsigned_char>._M_i == _Stack_3c);
    auVar13[0xd] = -(pgVar1->m[0xd].n.super___atomic_base<unsigned_char>._M_i == _Stack_3b);
    auVar13[0xe] = -(pgVar1->m[0xe].n.super___atomic_base<unsigned_char>._M_i == _Stack_3a);
    auVar13[0xf] = -(pgVar1->m[0xf].n.super___atomic_base<unsigned_char>._M_i == _Stack_39);
    uVar6 = (uint)(ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe);
    if (uVar6 != 0) {
      ppVar3 = (this->analyzedScopes).table_.
               super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
               .arrays.
               super_table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
               .elements_;
      this_00 = (this->analyzedScopes).table_.
                super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                .arrays.group_accesses_ + uVar10;
      boost::unordered::detail::foa::rw_spinlock::lock_shared(&this_00->m);
      do {
        uVar4 = 0;
        if (uVar6 != 0) {
          for (; (uVar6 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
          }
        }
        uVar7 = (ulong)uVar4;
        if ((pgVar2[uVar10].m[uVar7].n.super___atomic_base<unsigned_char>._M_i != '\0') &&
           (ppVar3[uVar10 * 0xf + uVar7].first == scope)) {
          if (ppVar3[uVar10 * 0xf + uVar7].second.
              super__Optional_base<const_slang::analysis::AnalyzedScope_*,_true,_true>._M_payload.
              super__Optional_payload_base<const_slang::analysis::AnalyzedScope_*>._M_engaged ==
              true) {
            pAVar8 = ppVar3[uVar10 * 0xf + uVar7].second.
                     super__Optional_base<const_slang::analysis::AnalyzedScope_*,_true,_true>.
                     _M_payload.super__Optional_payload_base<const_slang::analysis::AnalyzedScope_*>
                     ._M_payload._M_value;
          }
          else {
            pAVar8 = (AnalyzedScope *)0x0;
          }
          LOCK();
          (this_00->m).state_.super___atomic_base<unsigned_int>._M_i =
               (this_00->m).state_.super___atomic_base<unsigned_int>._M_i - 1;
          UNLOCK();
          goto LAB_0032a126;
        }
        uVar6 = uVar6 - 1 & uVar6;
      } while (uVar6 != 0);
      LOCK();
      (this_00->m).state_.super___atomic_base<unsigned_int>._M_i =
           (this_00->m).state_.super___atomic_base<unsigned_int>._M_i - 1;
      UNLOCK();
    }
    pAVar8 = (AnalyzedScope *)0x0;
    if ((*(byte *)((long)&boost::unordered::detail::foa::
                          group15<boost::unordered::detail::foa::atomic_integral>::
                          is_not_overflowed(unsigned_long)::shift + (ulong)((uint)uVar12 & 7)) &
        pgVar2[uVar10].m[0xf].n.super___atomic_base<unsigned_char>._M_i) == 0) break;
    uVar7 = (this->analyzedScopes).table_.
            super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
            .arrays.
            super_table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
            .groups_size_mask;
    lVar11 = uVar10 + uVar9;
    uVar9 = uVar9 + 1;
    uVar10 = lVar11 + 1U & uVar7;
  } while (uVar9 <= uVar7);
LAB_0032a126:
  if (local_50 == '\x01') {
    LOCK();
    *local_58 = *local_58 + -1;
    UNLOCK();
  }
  return pAVar8;
}

Assistant:

const AnalyzedScope* AnalysisManager::getAnalyzedScope(const Scope& scope) {
    const AnalyzedScope* result = nullptr;
    analyzedScopes.cvisit(&scope, [&result](auto& item) {
        if (item.second)
            result = *item.second;
    });
    return result;
}